

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void caffe::protobuf_caffe_2eproto::TableStruct::InitDefaultsImpl(void)

{
  undefined8 *local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined1 local_38;
  
  google::protobuf::internal::VerifyVersion
            (0x2dd278,0x2dd278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
            );
  google::protobuf::internal::InitProtobufDefaults();
  BlobShape::BlobShape((BlobShape *)&_BlobShape_default_instance_);
  DAT_0078fcb0 = 1;
  BlobProto::BlobProto((BlobProto *)&_BlobProto_default_instance_);
  DAT_0078fd48 = 1;
  BlobProtoVector::BlobProtoVector((BlobProtoVector *)&_BlobProtoVector_default_instance_);
  DAT_0078fd80 = 1;
  Datum::Datum((Datum *)&_Datum_default_instance_);
  DAT_0078fdd0 = 1;
  FillerParameter::_default_type__abi_cxx11_ = &DAT_007914a0;
  DAT_00791498 = 0;
  DAT_007914a0 = 0;
  DAT_007914b0 = 1;
  local_40 = 0x746e6174736e6f63;
  local_48 = 8;
  local_38 = 0;
  local_50 = &local_40;
  std::__cxx11::string::operator=
            ((string *)&FillerParameter::_default_type__abi_cxx11_,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  FillerParameter::FillerParameter((FillerParameter *)&_FillerParameter_default_instance_);
  DAT_0078fe18 = 1;
  NetParameter::NetParameter((NetParameter *)&_NetParameter_default_instance_);
  SolverParameter::_default_regularization_type__abi_cxx11_ = &DAT_007914c8;
  DAT_007914c0 = 0;
  DAT_0078fec0 = 1;
  DAT_007914c8 = 0;
  DAT_007914d8 = 1;
  local_48 = 2;
  local_40 = CONCAT53(local_40._3_5_,0x324c);
  local_50 = &local_40;
  std::__cxx11::string::operator=
            ((string *)&SolverParameter::_default_regularization_type__abi_cxx11_,
             (string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  SolverParameter::_default_type__abi_cxx11_ = &DAT_007914f0;
  DAT_007914e8 = 0;
  DAT_007914f0 = 0;
  DAT_00791500 = 1;
  local_40._0_4_ = 0x444753;
  local_48 = 3;
  local_50 = &local_40;
  std::__cxx11::string::operator=
            ((string *)&SolverParameter::_default_type__abi_cxx11_,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  SolverParameter::SolverParameter((SolverParameter *)&_SolverParameter_default_instance_);
  DAT_0078fff8 = 1;
  SolverState::SolverState((SolverState *)&_SolverState_default_instance_);
  DAT_00790040 = 1;
  NetState::NetState((NetState *)&_NetState_default_instance_);
  DAT_00790080 = 1;
  NetStateRule::NetStateRule((NetStateRule *)&_NetStateRule_default_instance_);
  DAT_007900e0 = 1;
  ParamSpec::ParamSpec((ParamSpec *)&_ParamSpec_default_instance_);
  DAT_00790118 = 1;
  LayerParameter::LayerParameter((LayerParameter *)&_LayerParameter_default_instance_);
  DAT_00790378 = 1;
  TransformationParameter::TransformationParameter
            ((TransformationParameter *)&_TransformationParameter_default_instance_);
  DAT_007903c0 = 1;
  LossParameter::LossParameter((LossParameter *)&_LossParameter_default_instance_);
  DAT_007903f0 = 1;
  AccuracyParameter::AccuracyParameter((AccuracyParameter *)&_AccuracyParameter_default_instance_);
  DAT_00790420 = 1;
  ArgMaxParameter::ArgMaxParameter((ArgMaxParameter *)&_ArgMaxParameter_default_instance_);
  DAT_00790450 = 1;
  ConcatParameter::ConcatParameter((ConcatParameter *)&_ConcatParameter_default_instance_);
  DAT_00790478 = 1;
  BatchNormParameter::BatchNormParameter
            ((BatchNormParameter *)&_BatchNormParameter_default_instance_);
  DAT_007904a8 = 1;
  BiasParameter::BiasParameter((BiasParameter *)&_BiasParameter_default_instance_);
  DAT_007904d8 = 1;
  ContrastiveLossParameter::ContrastiveLossParameter
            ((ContrastiveLossParameter *)&_ContrastiveLossParameter_default_instance_);
  DAT_00790500 = 1;
  ConvolutionParameter::ConvolutionParameter
            ((ConvolutionParameter *)&_ConvolutionParameter_default_instance_);
  DAT_007905a0 = 1;
  CropParameter::CropParameter((CropParameter *)&_CropParameter_default_instance_);
  DAT_007905d8 = 1;
  DataParameter::DataParameter((DataParameter *)&_DataParameter_default_instance_);
  DAT_00790628 = 1;
  DropoutParameter::DropoutParameter((DropoutParameter *)&_DropoutParameter_default_instance_);
  DAT_00790650 = 1;
  DummyDataParameter::DummyDataParameter
            ((DummyDataParameter *)&_DummyDataParameter_default_instance_);
  DAT_007906e0 = 1;
  EltwiseParameter::EltwiseParameter((EltwiseParameter *)&_EltwiseParameter_default_instance_);
  DAT_00790718 = 1;
  ELUParameter::ELUParameter((ELUParameter *)&_ELUParameter_default_instance_);
  DAT_00790740 = 1;
  EmbedParameter::EmbedParameter((EmbedParameter *)&_EmbedParameter_default_instance_);
  DAT_00790780 = 1;
  ExpParameter::ExpParameter((ExpParameter *)&_ExpParameter_default_instance_);
  DAT_007907b0 = 1;
  FlattenParameter::FlattenParameter((FlattenParameter *)&_FlattenParameter_default_instance_);
  DAT_007907d8 = 1;
  HDF5DataParameter::HDF5DataParameter((HDF5DataParameter *)&_HDF5DataParameter_default_instance_);
  DAT_00790808 = 1;
  HDF5OutputParameter::HDF5OutputParameter
            ((HDF5OutputParameter *)&_HDF5OutputParameter_default_instance_);
  DAT_00790830 = 1;
  HingeLossParameter::HingeLossParameter
            ((HingeLossParameter *)&_HingeLossParameter_default_instance_);
  DAT_00790858 = 1;
  ImageDataParameter::ImageDataParameter
            ((ImageDataParameter *)&_ImageDataParameter_default_instance_);
  DAT_007908b0 = 1;
  InfogainLossParameter::InfogainLossParameter
            ((InfogainLossParameter *)&_InfogainLossParameter_default_instance_);
  DAT_007908d8 = 1;
  InnerProductParameter::InnerProductParameter
            ((InnerProductParameter *)&_InnerProductParameter_default_instance_);
  DAT_00790918 = 1;
  InputParameter::InputParameter((InputParameter *)&_InputParameter_default_instance_);
  DAT_00790950 = 1;
  LogParameter::LogParameter((LogParameter *)&_LogParameter_default_instance_);
  DAT_00790980 = 1;
  LRNParameter::LRNParameter((LRNParameter *)&_LRNParameter_default_instance_);
  DAT_007909b8 = 1;
  MemoryDataParameter::MemoryDataParameter
            ((MemoryDataParameter *)&_MemoryDataParameter_default_instance_);
  DAT_007909e8 = 1;
  MVNParameter::MVNParameter((MVNParameter *)&_MVNParameter_default_instance_);
  DAT_00790a10 = 1;
  ParameterParameter::ParameterParameter
            ((ParameterParameter *)&_ParameterParameter_default_instance_);
  DAT_00790a38 = 1;
  PoolingParameter::PoolingParameter((PoolingParameter *)&_PoolingParameter_default_instance_);
  DAT_00790a88 = 1;
  PowerParameter::PowerParameter((PowerParameter *)&_PowerParameter_default_instance_);
  DAT_00790ab8 = 1;
  PythonParameter::PythonParameter((PythonParameter *)&_PythonParameter_default_instance_);
  DAT_00790af8 = 1;
  RecurrentParameter::RecurrentParameter
            ((RecurrentParameter *)&_RecurrentParameter_default_instance_);
  DAT_00790b30 = 1;
  ReductionParameter::ReductionParameter
            ((ReductionParameter *)&_ReductionParameter_default_instance_);
  DAT_00790b60 = 1;
  ReLUParameter::ReLUParameter((ReLUParameter *)&_ReLUParameter_default_instance_);
  DAT_00790b88 = 1;
  ReshapeParameter::ReshapeParameter((ReshapeParameter *)&_ReshapeParameter_default_instance_);
  DAT_00790bb8 = 1;
  ScaleParameter::ScaleParameter((ScaleParameter *)&_ScaleParameter_default_instance_);
  DAT_00790bf8 = 1;
  SigmoidParameter::SigmoidParameter((SigmoidParameter *)&_SigmoidParameter_default_instance_);
  DAT_00790c20 = 1;
  SliceParameter::SliceParameter((SliceParameter *)&_SliceParameter_default_instance_);
  DAT_00790c58 = 1;
  SoftmaxParameter::SoftmaxParameter((SoftmaxParameter *)&_SoftmaxParameter_default_instance_);
  DAT_00790c80 = 1;
  TanHParameter::TanHParameter((TanHParameter *)&_TanHParameter_default_instance_);
  DAT_00790ca8 = 1;
  TileParameter::TileParameter((TileParameter *)&_TileParameter_default_instance_);
  DAT_00790cd0 = 1;
  ThresholdParameter::ThresholdParameter
            ((ThresholdParameter *)&_ThresholdParameter_default_instance_);
  DAT_00790cf8 = 1;
  WindowDataParameter::_default_crop_mode__abi_cxx11_ = &DAT_00791518;
  DAT_00791510 = 0;
  DAT_00791518 = 0;
  DAT_00791528 = 1;
  local_50 = &local_40;
  local_48 = 4;
  local_40._0_5_ = 0x70726177;
  std::__cxx11::string::operator=
            ((string *)&WindowDataParameter::_default_crop_mode__abi_cxx11_,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  WindowDataParameter::WindowDataParameter
            ((WindowDataParameter *)&_WindowDataParameter_default_instance_);
  DAT_00790d58 = 1;
  SPPParameter::SPPParameter((SPPParameter *)&_SPPParameter_default_instance_);
  DAT_00790d88 = 1;
  V1LayerParameter::V1LayerParameter((V1LayerParameter *)&_V1LayerParameter_default_instance_);
  V0LayerParameter::_default_det_crop_mode__abi_cxx11_ = &DAT_00791540;
  DAT_00791538 = 0;
  DAT_00790f80 = 1;
  DAT_00791540 = 0;
  DAT_00791550 = 1;
  local_50 = &local_40;
  local_48 = 4;
  local_40 = CONCAT35(local_40._5_3_,0x70726177);
  std::__cxx11::string::operator=
            ((string *)&V0LayerParameter::_default_det_crop_mode__abi_cxx11_,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  V0LayerParameter::V0LayerParameter((V0LayerParameter *)&_V0LayerParameter_default_instance_);
  DAT_00791088 = 1;
  PReLUParameter::PReLUParameter((PReLUParameter *)&_PReLUParameter_default_instance_);
  _DAT_0078feb0 = &_NetState_default_instance_;
  _DAT_0078ff80 = &_NetParameter_default_instance_;
  _DAT_0078ff78 = &_NetParameter_default_instance_;
  _DAT_0078ff88 = &_NetState_default_instance_;
  _DAT_0078fd30 = &_BlobShape_default_instance_;
  _DAT_007901f8 = &_TransformationParameter_default_instance_;
  _DAT_00790200 = &_LossParameter_default_instance_;
  _DAT_00790208 = &_AccuracyParameter_default_instance_;
  _DAT_00790210 = &_ArgMaxParameter_default_instance_;
  _DAT_00790330 = &_BatchNormParameter_default_instance_;
  _DAT_00790340 = &_BiasParameter_default_instance_;
  _DAT_00790218 = &_ConcatParameter_default_instance_;
  _DAT_00790220 = &_ContrastiveLossParameter_default_instance_;
  _DAT_00790228 = &_ConvolutionParameter_default_instance_;
  _DAT_00790358 = &_CropParameter_default_instance_;
  _DAT_00790230 = &_DataParameter_default_instance_;
  _DAT_00790238 = &_DropoutParameter_default_instance_;
  _DAT_00790240 = &_DummyDataParameter_default_instance_;
  _DAT_00790248 = &_EltwiseParameter_default_instance_;
  _DAT_00790338 = &_ELUParameter_default_instance_;
  _DAT_00790320 = &_EmbedParameter_default_instance_;
  _DAT_00790250 = &_ExpParameter_default_instance_;
  _DAT_00790310 = &_FlattenParameter_default_instance_;
  _DAT_00790258 = &_HDF5DataParameter_default_instance_;
  _DAT_00790260 = &_HDF5OutputParameter_default_instance_;
  _DAT_00790268 = &_HingeLossParameter_default_instance_;
  _DAT_00790270 = &_ImageDataParameter_default_instance_;
  _DAT_00790278 = &_InfogainLossParameter_default_instance_;
  _DAT_00790280 = &_InnerProductParameter_default_instance_;
  _DAT_00790350 = &_InputParameter_default_instance_;
  _DAT_00790308 = &_LogParameter_default_instance_;
  _DAT_00790288 = &_LRNParameter_default_instance_;
  _DAT_00790290 = &_MemoryDataParameter_default_instance_;
  _DAT_00790298 = &_MVNParameter_default_instance_;
  _DAT_00790360 = &_ParameterParameter_default_instance_;
  _DAT_007902a0 = &_PoolingParameter_default_instance_;
  _DAT_007902a8 = &_PowerParameter_default_instance_;
  _DAT_007902f0 = &_PReLUParameter_default_instance_;
  _DAT_007902e8 = &_PythonParameter_default_instance_;
  _DAT_00790368 = &_RecurrentParameter_default_instance_;
  _DAT_00790318 = &_ReductionParameter_default_instance_;
  _DAT_00790a30 = &_BlobShape_default_instance_;
  _DAT_00790ba8 = &_BlobShape_default_instance_;
  _DAT_007902b0 = &_ReLUParameter_default_instance_;
  _DAT_00790300 = &_ReshapeParameter_default_instance_;
  _DAT_00790348 = &_ScaleParameter_default_instance_;
  _DAT_007902b8 = &_SigmoidParameter_default_instance_;
  _DAT_007902c0 = &_SoftmaxParameter_default_instance_;
  _DAT_007902f8 = &_SPPParameter_default_instance_;
  _DAT_007902c8 = &_SliceParameter_default_instance_;
  _DAT_007902d0 = &_TanHParameter_default_instance_;
  _DAT_007902d8 = &_ThresholdParameter_default_instance_;
  _DAT_00790328 = &_TileParameter_default_instance_;
  _DAT_007902e0 = &_WindowDataParameter_default_instance_;
  _DAT_00790f18 = &_AccuracyParameter_default_instance_;
  _DAT_00790ef8 = &_ArgMaxParameter_default_instance_;
  _DAT_00790e88 = &_ConcatParameter_default_instance_;
  _DAT_00790f60 = &_ContrastiveLossParameter_default_instance_;
  _DAT_00790e90 = &_ConvolutionParameter_default_instance_;
  _DAT_00790e98 = &_DataParameter_default_instance_;
  _DAT_00790ea0 = &_DropoutParameter_default_instance_;
  _DAT_00790f10 = &_DummyDataParameter_default_instance_;
  _DAT_00790f00 = &_EltwiseParameter_default_instance_;
  _DAT_00790f68 = &_ExpParameter_default_instance_;
  _DAT_00790ea8 = &_HDF5DataParameter_default_instance_;
  _DAT_00790eb0 = &_HDF5OutputParameter_default_instance_;
  _DAT_00790f20 = &_HingeLossParameter_default_instance_;
  _DAT_00790eb8 = &_ImageDataParameter_default_instance_;
  _DAT_00790ec0 = &_InfogainLossParameter_default_instance_;
  _DAT_00790ec8 = &_InnerProductParameter_default_instance_;
  _DAT_00790ed0 = &_LRNParameter_default_instance_;
  _DAT_00790ef0 = &_MemoryDataParameter_default_instance_;
  _DAT_00790f38 = &_MVNParameter_default_instance_;
  _DAT_00790ed8 = &_PoolingParameter_default_instance_;
  _DAT_00790ee8 = &_PowerParameter_default_instance_;
  _DAT_00790f28 = &_ReLUParameter_default_instance_;
  _DAT_00790f50 = &_SigmoidParameter_default_instance_;
  _DAT_00790f58 = &_SoftmaxParameter_default_instance_;
  _DAT_00790f30 = &_SliceParameter_default_instance_;
  _DAT_00790f48 = &_TanHParameter_default_instance_;
  _DAT_00790f08 = &_ThresholdParameter_default_instance_;
  _DAT_00790ee0 = &_WindowDataParameter_default_instance_;
  _DAT_00790f40 = &_TransformationParameter_default_instance_;
  _DAT_00790f70 = &_LossParameter_default_instance_;
  _DAT_00790e80 = &_V0LayerParameter_default_instance_;
  _DAT_00791000 = &_FillerParameter_default_instance_;
  _DAT_00791008 = &_FillerParameter_default_instance_;
  _DAT_00791010 = &_HDF5OutputParameter_default_instance_;
  _DAT_007904c8 = &_FillerParameter_default_instance_;
  _DAT_00790560 = &_FillerParameter_default_instance_;
  _DAT_00790568 = &_FillerParameter_default_instance_;
  _DAT_00790760 = &_FillerParameter_default_instance_;
  _DAT_00790768 = &_FillerParameter_default_instance_;
  _DAT_007908f8 = &_FillerParameter_default_instance_;
  _DAT_00790900 = &_FillerParameter_default_instance_;
  _DAT_00790b18 = &_FillerParameter_default_instance_;
  _DAT_00790b20 = &_FillerParameter_default_instance_;
  _DAT_00790bd8 = &_FillerParameter_default_instance_;
  _DAT_00790be0 = &_FillerParameter_default_instance_;
  DAT_007910b8 = 1;
  _DAT_007910a8 = &_FillerParameter_default_instance_;
  return;
}

Assistant:

void TableStruct::InitDefaultsImpl() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  ::google::protobuf::internal::InitProtobufDefaults();
  _BlobShape_default_instance_.DefaultConstruct();
  _BlobProto_default_instance_.DefaultConstruct();
  _BlobProtoVector_default_instance_.DefaultConstruct();
  _Datum_default_instance_.DefaultConstruct();
  FillerParameter::_default_type_.DefaultConstruct();
  *FillerParameter::_default_type_.get_mutable() = ::std::string("constant", 8);
  _FillerParameter_default_instance_.DefaultConstruct();
  _NetParameter_default_instance_.DefaultConstruct();
  SolverParameter::_default_regularization_type_.DefaultConstruct();
  *SolverParameter::_default_regularization_type_.get_mutable() = ::std::string("L2", 2);
  SolverParameter::_default_type_.DefaultConstruct();
  *SolverParameter::_default_type_.get_mutable() = ::std::string("SGD", 3);
  _SolverParameter_default_instance_.DefaultConstruct();
  _SolverState_default_instance_.DefaultConstruct();
  _NetState_default_instance_.DefaultConstruct();
  _NetStateRule_default_instance_.DefaultConstruct();
  _ParamSpec_default_instance_.DefaultConstruct();
  _LayerParameter_default_instance_.DefaultConstruct();
  _TransformationParameter_default_instance_.DefaultConstruct();
  _LossParameter_default_instance_.DefaultConstruct();
  _AccuracyParameter_default_instance_.DefaultConstruct();
  _ArgMaxParameter_default_instance_.DefaultConstruct();
  _ConcatParameter_default_instance_.DefaultConstruct();
  _BatchNormParameter_default_instance_.DefaultConstruct();
  _BiasParameter_default_instance_.DefaultConstruct();
  _ContrastiveLossParameter_default_instance_.DefaultConstruct();
  _ConvolutionParameter_default_instance_.DefaultConstruct();
  _CropParameter_default_instance_.DefaultConstruct();
  _DataParameter_default_instance_.DefaultConstruct();
  _DropoutParameter_default_instance_.DefaultConstruct();
  _DummyDataParameter_default_instance_.DefaultConstruct();
  _EltwiseParameter_default_instance_.DefaultConstruct();
  _ELUParameter_default_instance_.DefaultConstruct();
  _EmbedParameter_default_instance_.DefaultConstruct();
  _ExpParameter_default_instance_.DefaultConstruct();
  _FlattenParameter_default_instance_.DefaultConstruct();
  _HDF5DataParameter_default_instance_.DefaultConstruct();
  _HDF5OutputParameter_default_instance_.DefaultConstruct();
  _HingeLossParameter_default_instance_.DefaultConstruct();
  _ImageDataParameter_default_instance_.DefaultConstruct();
  _InfogainLossParameter_default_instance_.DefaultConstruct();
  _InnerProductParameter_default_instance_.DefaultConstruct();
  _InputParameter_default_instance_.DefaultConstruct();
  _LogParameter_default_instance_.DefaultConstruct();
  _LRNParameter_default_instance_.DefaultConstruct();
  _MemoryDataParameter_default_instance_.DefaultConstruct();
  _MVNParameter_default_instance_.DefaultConstruct();
  _ParameterParameter_default_instance_.DefaultConstruct();
  _PoolingParameter_default_instance_.DefaultConstruct();
  _PowerParameter_default_instance_.DefaultConstruct();
  _PythonParameter_default_instance_.DefaultConstruct();
  _RecurrentParameter_default_instance_.DefaultConstruct();
  _ReductionParameter_default_instance_.DefaultConstruct();
  _ReLUParameter_default_instance_.DefaultConstruct();
  _ReshapeParameter_default_instance_.DefaultConstruct();
  _ScaleParameter_default_instance_.DefaultConstruct();
  _SigmoidParameter_default_instance_.DefaultConstruct();
  _SliceParameter_default_instance_.DefaultConstruct();
  _SoftmaxParameter_default_instance_.DefaultConstruct();
  _TanHParameter_default_instance_.DefaultConstruct();
  _TileParameter_default_instance_.DefaultConstruct();
  _ThresholdParameter_default_instance_.DefaultConstruct();
  WindowDataParameter::_default_crop_mode_.DefaultConstruct();
  *WindowDataParameter::_default_crop_mode_.get_mutable() = ::std::string("warp", 4);
  _WindowDataParameter_default_instance_.DefaultConstruct();
  _SPPParameter_default_instance_.DefaultConstruct();
  _V1LayerParameter_default_instance_.DefaultConstruct();
  V0LayerParameter::_default_det_crop_mode_.DefaultConstruct();
  *V0LayerParameter::_default_det_crop_mode_.get_mutable() = ::std::string("warp", 4);
  _V0LayerParameter_default_instance_.DefaultConstruct();
  _PReLUParameter_default_instance_.DefaultConstruct();
  _BlobProto_default_instance_.get_mutable()->shape_ = const_cast< ::caffe::BlobShape*>(
      ::caffe::BlobShape::internal_default_instance());
  _NetParameter_default_instance_.get_mutable()->state_ = const_cast< ::caffe::NetState*>(
      ::caffe::NetState::internal_default_instance());
  _SolverParameter_default_instance_.get_mutable()->net_param_ = const_cast< ::caffe::NetParameter*>(
      ::caffe::NetParameter::internal_default_instance());
  _SolverParameter_default_instance_.get_mutable()->train_net_param_ = const_cast< ::caffe::NetParameter*>(
      ::caffe::NetParameter::internal_default_instance());
  _SolverParameter_default_instance_.get_mutable()->train_state_ = const_cast< ::caffe::NetState*>(
      ::caffe::NetState::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->transform_param_ = const_cast< ::caffe::TransformationParameter*>(
      ::caffe::TransformationParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->loss_param_ = const_cast< ::caffe::LossParameter*>(
      ::caffe::LossParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->accuracy_param_ = const_cast< ::caffe::AccuracyParameter*>(
      ::caffe::AccuracyParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->argmax_param_ = const_cast< ::caffe::ArgMaxParameter*>(
      ::caffe::ArgMaxParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->batch_norm_param_ = const_cast< ::caffe::BatchNormParameter*>(
      ::caffe::BatchNormParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->bias_param_ = const_cast< ::caffe::BiasParameter*>(
      ::caffe::BiasParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->concat_param_ = const_cast< ::caffe::ConcatParameter*>(
      ::caffe::ConcatParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->contrastive_loss_param_ = const_cast< ::caffe::ContrastiveLossParameter*>(
      ::caffe::ContrastiveLossParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->convolution_param_ = const_cast< ::caffe::ConvolutionParameter*>(
      ::caffe::ConvolutionParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->crop_param_ = const_cast< ::caffe::CropParameter*>(
      ::caffe::CropParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->data_param_ = const_cast< ::caffe::DataParameter*>(
      ::caffe::DataParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->dropout_param_ = const_cast< ::caffe::DropoutParameter*>(
      ::caffe::DropoutParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->dummy_data_param_ = const_cast< ::caffe::DummyDataParameter*>(
      ::caffe::DummyDataParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->eltwise_param_ = const_cast< ::caffe::EltwiseParameter*>(
      ::caffe::EltwiseParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->elu_param_ = const_cast< ::caffe::ELUParameter*>(
      ::caffe::ELUParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->embed_param_ = const_cast< ::caffe::EmbedParameter*>(
      ::caffe::EmbedParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->exp_param_ = const_cast< ::caffe::ExpParameter*>(
      ::caffe::ExpParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->flatten_param_ = const_cast< ::caffe::FlattenParameter*>(
      ::caffe::FlattenParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->hdf5_data_param_ = const_cast< ::caffe::HDF5DataParameter*>(
      ::caffe::HDF5DataParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->hdf5_output_param_ = const_cast< ::caffe::HDF5OutputParameter*>(
      ::caffe::HDF5OutputParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->hinge_loss_param_ = const_cast< ::caffe::HingeLossParameter*>(
      ::caffe::HingeLossParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->image_data_param_ = const_cast< ::caffe::ImageDataParameter*>(
      ::caffe::ImageDataParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->infogain_loss_param_ = const_cast< ::caffe::InfogainLossParameter*>(
      ::caffe::InfogainLossParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->inner_product_param_ = const_cast< ::caffe::InnerProductParameter*>(
      ::caffe::InnerProductParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->input_param_ = const_cast< ::caffe::InputParameter*>(
      ::caffe::InputParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->log_param_ = const_cast< ::caffe::LogParameter*>(
      ::caffe::LogParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->lrn_param_ = const_cast< ::caffe::LRNParameter*>(
      ::caffe::LRNParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->memory_data_param_ = const_cast< ::caffe::MemoryDataParameter*>(
      ::caffe::MemoryDataParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->mvn_param_ = const_cast< ::caffe::MVNParameter*>(
      ::caffe::MVNParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->parameter_param_ = const_cast< ::caffe::ParameterParameter*>(
      ::caffe::ParameterParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->pooling_param_ = const_cast< ::caffe::PoolingParameter*>(
      ::caffe::PoolingParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->power_param_ = const_cast< ::caffe::PowerParameter*>(
      ::caffe::PowerParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->prelu_param_ = const_cast< ::caffe::PReLUParameter*>(
      ::caffe::PReLUParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->python_param_ = const_cast< ::caffe::PythonParameter*>(
      ::caffe::PythonParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->recurrent_param_ = const_cast< ::caffe::RecurrentParameter*>(
      ::caffe::RecurrentParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->reduction_param_ = const_cast< ::caffe::ReductionParameter*>(
      ::caffe::ReductionParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->relu_param_ = const_cast< ::caffe::ReLUParameter*>(
      ::caffe::ReLUParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->reshape_param_ = const_cast< ::caffe::ReshapeParameter*>(
      ::caffe::ReshapeParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->scale_param_ = const_cast< ::caffe::ScaleParameter*>(
      ::caffe::ScaleParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->sigmoid_param_ = const_cast< ::caffe::SigmoidParameter*>(
      ::caffe::SigmoidParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->softmax_param_ = const_cast< ::caffe::SoftmaxParameter*>(
      ::caffe::SoftmaxParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->spp_param_ = const_cast< ::caffe::SPPParameter*>(
      ::caffe::SPPParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->slice_param_ = const_cast< ::caffe::SliceParameter*>(
      ::caffe::SliceParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->tanh_param_ = const_cast< ::caffe::TanHParameter*>(
      ::caffe::TanHParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->threshold_param_ = const_cast< ::caffe::ThresholdParameter*>(
      ::caffe::ThresholdParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->tile_param_ = const_cast< ::caffe::TileParameter*>(
      ::caffe::TileParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->window_data_param_ = const_cast< ::caffe::WindowDataParameter*>(
      ::caffe::WindowDataParameter::internal_default_instance());
  _BiasParameter_default_instance_.get_mutable()->filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _ConvolutionParameter_default_instance_.get_mutable()->weight_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _ConvolutionParameter_default_instance_.get_mutable()->bias_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _EmbedParameter_default_instance_.get_mutable()->weight_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _EmbedParameter_default_instance_.get_mutable()->bias_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _InnerProductParameter_default_instance_.get_mutable()->weight_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _InnerProductParameter_default_instance_.get_mutable()->bias_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _ParameterParameter_default_instance_.get_mutable()->shape_ = const_cast< ::caffe::BlobShape*>(
      ::caffe::BlobShape::internal_default_instance());
  _RecurrentParameter_default_instance_.get_mutable()->weight_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _RecurrentParameter_default_instance_.get_mutable()->bias_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _ReshapeParameter_default_instance_.get_mutable()->shape_ = const_cast< ::caffe::BlobShape*>(
      ::caffe::BlobShape::internal_default_instance());
  _ScaleParameter_default_instance_.get_mutable()->filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _ScaleParameter_default_instance_.get_mutable()->bias_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->accuracy_param_ = const_cast< ::caffe::AccuracyParameter*>(
      ::caffe::AccuracyParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->argmax_param_ = const_cast< ::caffe::ArgMaxParameter*>(
      ::caffe::ArgMaxParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->concat_param_ = const_cast< ::caffe::ConcatParameter*>(
      ::caffe::ConcatParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->contrastive_loss_param_ = const_cast< ::caffe::ContrastiveLossParameter*>(
      ::caffe::ContrastiveLossParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->convolution_param_ = const_cast< ::caffe::ConvolutionParameter*>(
      ::caffe::ConvolutionParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->data_param_ = const_cast< ::caffe::DataParameter*>(
      ::caffe::DataParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->dropout_param_ = const_cast< ::caffe::DropoutParameter*>(
      ::caffe::DropoutParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->dummy_data_param_ = const_cast< ::caffe::DummyDataParameter*>(
      ::caffe::DummyDataParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->eltwise_param_ = const_cast< ::caffe::EltwiseParameter*>(
      ::caffe::EltwiseParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->exp_param_ = const_cast< ::caffe::ExpParameter*>(
      ::caffe::ExpParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->hdf5_data_param_ = const_cast< ::caffe::HDF5DataParameter*>(
      ::caffe::HDF5DataParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->hdf5_output_param_ = const_cast< ::caffe::HDF5OutputParameter*>(
      ::caffe::HDF5OutputParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->hinge_loss_param_ = const_cast< ::caffe::HingeLossParameter*>(
      ::caffe::HingeLossParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->image_data_param_ = const_cast< ::caffe::ImageDataParameter*>(
      ::caffe::ImageDataParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->infogain_loss_param_ = const_cast< ::caffe::InfogainLossParameter*>(
      ::caffe::InfogainLossParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->inner_product_param_ = const_cast< ::caffe::InnerProductParameter*>(
      ::caffe::InnerProductParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->lrn_param_ = const_cast< ::caffe::LRNParameter*>(
      ::caffe::LRNParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->memory_data_param_ = const_cast< ::caffe::MemoryDataParameter*>(
      ::caffe::MemoryDataParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->mvn_param_ = const_cast< ::caffe::MVNParameter*>(
      ::caffe::MVNParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->pooling_param_ = const_cast< ::caffe::PoolingParameter*>(
      ::caffe::PoolingParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->power_param_ = const_cast< ::caffe::PowerParameter*>(
      ::caffe::PowerParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->relu_param_ = const_cast< ::caffe::ReLUParameter*>(
      ::caffe::ReLUParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->sigmoid_param_ = const_cast< ::caffe::SigmoidParameter*>(
      ::caffe::SigmoidParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->softmax_param_ = const_cast< ::caffe::SoftmaxParameter*>(
      ::caffe::SoftmaxParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->slice_param_ = const_cast< ::caffe::SliceParameter*>(
      ::caffe::SliceParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->tanh_param_ = const_cast< ::caffe::TanHParameter*>(
      ::caffe::TanHParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->threshold_param_ = const_cast< ::caffe::ThresholdParameter*>(
      ::caffe::ThresholdParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->window_data_param_ = const_cast< ::caffe::WindowDataParameter*>(
      ::caffe::WindowDataParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->transform_param_ = const_cast< ::caffe::TransformationParameter*>(
      ::caffe::TransformationParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->loss_param_ = const_cast< ::caffe::LossParameter*>(
      ::caffe::LossParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->layer_ = const_cast< ::caffe::V0LayerParameter*>(
      ::caffe::V0LayerParameter::internal_default_instance());
  _V0LayerParameter_default_instance_.get_mutable()->weight_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _V0LayerParameter_default_instance_.get_mutable()->bias_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _V0LayerParameter_default_instance_.get_mutable()->hdf5_output_param_ = const_cast< ::caffe::HDF5OutputParameter*>(
      ::caffe::HDF5OutputParameter::internal_default_instance());
  _PReLUParameter_default_instance_.get_mutable()->filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
}